

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer,char *caller)

{
  list_head *plVar1;
  list_head *plVar2;
  list_head *plVar3;
  undefined8 in_RAX;
  pthread_mutex_t *__mutex;
  MppBufferService *pMVar4;
  hlist_node *phVar5;
  MPP_RET MVar6;
  hlist_node ***ppphVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_ref_inc");
  }
  pthread_mutex_lock((pthread_mutex_t *)&buffer->lock);
  buffer->ref_count = buffer->ref_count + 1;
  buf_add_log(buffer,BUF_REF_INC,caller);
  MVar6 = MPP_OK;
  if (buffer->used == 0) {
    __mutex = (pthread_mutex_t *)MppBufferService::get_lock();
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    pMVar4 = MppBufferService::get_instance();
    ppphVar7 = (hlist_node ***)0x0;
    for (phVar5 = pMVar4->mHashGroup[buffer->group_id * 0x61c88647 >> 0x18].first;
        phVar5 != (hlist_node *)0x0; phVar5 = phVar5->next) {
      if (*(RK_U32 *)((long)&phVar5[-9].pprev + 4) == buffer->group_id) {
        ppphVar7 = &phVar5[-0xd].pprev;
        break;
      }
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
    if (ppphVar7 == (hlist_node ***)0x0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"group",
                 "inc_buffer_ref",CONCAT44(uVar8,0x164));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      buffer->used = 1;
      _mpp_log_l(2,"mpp_buffer","unused buffer without group\n","inc_buffer_ref");
      MVar6 = MPP_NOK;
    }
    else {
      buffer->used = 1;
      pthread_mutex_lock((pthread_mutex_t *)(ppphVar7 + 0x14));
      plVar1 = &buffer->list_status;
      plVar2 = (buffer->list_status).next;
      plVar3 = (buffer->list_status).prev;
      plVar2->prev = plVar3;
      plVar3->next = plVar2;
      (buffer->list_status).prev = plVar1;
      plVar2 = (list_head *)ppphVar7[0x1c];
      ppphVar7[0x1c] = (hlist_node **)plVar1;
      (buffer->list_status).next = (list_head *)(ppphVar7 + 0x1b);
      (buffer->list_status).prev = plVar2;
      plVar2->next = plVar1;
      ppphVar7[0x1f] =
           (hlist_node **)
           CONCAT44((int)((ulong)ppphVar7[0x1f] >> 0x20) + -1,(int)ppphVar7[0x1f] + 1);
      pthread_mutex_unlock((pthread_mutex_t *)(ppphVar7 + 0x14));
      MVar6 = MPP_OK;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&buffer->lock);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_ref_inc");
  }
  return MVar6;
}

Assistant:

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = inc_buffer_ref(buffer, caller);

    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}